

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void ts_parser_reset(TSParser *self)

{
  _func_void_void_ptr_char_ptr_uint *p_Var1;
  
  p_Var1 = (self->language->external_scanner).deserialize;
  if (p_Var1 != (_func_void_void_ptr_char_ptr_uint *)0x0) {
    (*p_Var1)(self->external_scanner_payload,(char *)0x0,0);
  }
  if ((self->old_tree).ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_release(&self->tree_pool,self->old_tree);
    (self->old_tree).ptr = (SubtreeHeapData *)0x0;
  }
  (self->reusable_node).stack.size = 0;
  (self->reusable_node).last_external_token.ptr = (SubtreeHeapData *)0x0;
  ts_lexer_reset(&self->lexer,(Length)ZEXT812(0));
  ts_stack_clear(self->stack);
  ts_parser__set_cached_token(self,0,(Subtree)0x0,(Subtree)0x0);
  if ((self->finished_tree).ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_release(&self->tree_pool,self->finished_tree);
    (self->finished_tree).ptr = (SubtreeHeapData *)0x0;
  }
  self->accept_count = 0;
  return;
}

Assistant:

void ts_parser_reset(TSParser *self) {
  if (self->language->external_scanner.deserialize) {
    self->language->external_scanner.deserialize(self->external_scanner_payload, NULL, 0);
  }

  if (self->old_tree.ptr) {
    ts_subtree_release(&self->tree_pool, self->old_tree);
    self->old_tree = NULL_SUBTREE;
  }

  reusable_node_clear(&self->reusable_node);
  ts_lexer_reset(&self->lexer, length_zero());
  ts_stack_clear(self->stack);
  ts_parser__set_cached_token(self, 0, NULL_SUBTREE, NULL_SUBTREE);
  if (self->finished_tree.ptr) {
    ts_subtree_release(&self->tree_pool, self->finished_tree);
    self->finished_tree = NULL_SUBTREE;
  }
  self->accept_count = 0;
}